

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O2

string * pbrt::Yellow(string *__return_storage_ptr__,string *s)

{
  allocator<char> local_7a;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"\x1b[1m\x1b[38;5;100m",&local_79);
  std::operator+(&local_58,&local_38,s);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"\x1b[0m",&local_7a);
  std::operator+(__return_storage_ptr__,&local_58,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

inline std::string Yellow(const std::string &s) {
    // https://en.wikipedia.org/wiki/ANSI_escape_code#8-bit
    const char *yellow = "\033[1m\033[38;5;100m";
    const char *reset = "\033[0m";
    return std::string(yellow) + s + std::string(reset);
}